

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Accuracy::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Context *pCVar2;
  bool bVar3;
  TestNode *node;
  TestNode *node_00;
  long *plVar4;
  Texture2DFilteringCase *this_00;
  long lVar5;
  ulong uVar6;
  TextureCubeFilteringCase *this_01;
  uint uVar7;
  long *plVar8;
  size_type *psVar9;
  undefined *puVar10;
  bool bVar11;
  long lVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  uint local_174;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  uint local_10c;
  uint local_108;
  uint local_104;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  string name;
  long *local_b0 [2];
  long local_a0 [2];
  ulong local_90;
  undefined8 local_88;
  long local_80;
  ulong local_78;
  anon_struct_16_2_3f8b7511 *local_70;
  ulong local_68;
  anon_struct_16_2_3f8b7511 *local_60;
  ulong local_58;
  anon_struct_16_2_3f8b7511 *local_50;
  TextureFilteringTests *local_48;
  long local_40;
  TestNode *local_38;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Filtering");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,node);
  local_48 = this;
  local_38 = node_00;
  tcu::TestNode::addChild((TestNode *)this,node_00);
  lVar12 = 0;
  do {
    local_70 = init::minFilterModes + lVar12;
    local_78 = (ulong)init::minFilterModes[lVar12].mode;
    local_174 = init::minFilterModes[lVar12].mode & 0xfffffffe;
    puVar10 = &DAT_0076c401;
    local_10c = local_174 ^ 0x2600;
    lVar5 = 0;
    local_40 = lVar12;
    do {
      local_90 = CONCAT44(local_90._4_4_,(int)puVar10);
      local_60 = init::magFilterModes + lVar5;
      local_68 = (ulong)init::magFilterModes[lVar5].mode;
      local_108 = init::magFilterModes[lVar5].mode ^ 0x2600;
      uVar6 = 0;
      do {
        local_50 = init::wrapModes + uVar6;
        uVar1 = init::wrapModes[uVar6].mode;
        local_58 = (ulong)uVar1;
        bVar3 = local_10c == 0;
        uVar7 = uVar1 ^ 0x2901 | local_108;
        local_80 = CONCAT71(local_80._1_7_,uVar7 == 0);
        puVar10 = (undefined *)CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
        lVar12 = 0;
        local_88 = uVar6;
        do {
          bVar14 = local_174 == 0x2600;
          local_104 = (uint)puVar10;
          bVar13 = (byte)puVar10 | (byte)local_80;
          lVar5 = 0;
          bVar15 = true;
          do {
            bVar11 = bVar15;
            uVar7 = init::sizes2D[lVar5].width;
            if ((uVar7 & uVar7 - 1) == 0) {
              bVar15 = (init::sizes2D[lVar5].height & init::sizes2D[lVar5].height - 1U) == 0;
            }
            else {
              bVar15 = false;
            }
            if ((byte)((bVar15 | (uVar1 == 0x812f && bVar3)) & (bVar13 | bVar14)) == 1) {
              local_b0[0] = local_a0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
              plVar4 = (long *)std::__cxx11::string::append((char *)local_b0);
              local_170 = &local_160;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_160 = *plVar8;
                lStack_158 = plVar4[3];
              }
              else {
                local_160 = *plVar8;
                local_170 = (long *)*plVar4;
              }
              local_168 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
              local_150 = &local_140;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_140 = *plVar8;
                lStack_138 = plVar4[3];
              }
              else {
                local_140 = *plVar8;
                local_150 = (long *)*plVar4;
              }
              local_148 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
              local_130 = &local_120;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_120 = *plVar8;
                lStack_118 = plVar4[3];
              }
              else {
                local_120 = *plVar8;
                local_130 = (long *)*plVar4;
              }
              local_128 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
              local_100 = &local_f0;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_f0 = *plVar8;
                lStack_e8 = plVar4[3];
              }
              else {
                local_f0 = *plVar8;
                local_100 = (long *)*plVar4;
              }
              local_f8 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
              local_198 = &local_188;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_188 = *plVar8;
                lStack_180 = plVar4[3];
              }
              else {
                local_188 = *plVar8;
                local_198 = (long *)*plVar4;
              }
              local_190 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
              local_1b8 = &local_1a8;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_1a8 = *plVar8;
                lStack_1a0 = plVar4[3];
              }
              else {
                local_1a8 = *plVar8;
                local_1b8 = (long *)*plVar4;
              }
              local_1b0 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar9 = (size_type *)(plVar4 + 2);
              if ((size_type *)*plVar4 == psVar9) {
                name.field_2._M_allocated_capacity = *psVar9;
                name.field_2._8_8_ = plVar4[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar9;
                name._M_dataplus._M_p = (pointer)*plVar4;
              }
              name._M_string_length = plVar4[1];
              *plVar4 = (long)psVar9;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              if (local_1b8 != &local_1a8) {
                operator_delete(local_1b8,local_1a8 + 1);
              }
              if (local_198 != &local_188) {
                operator_delete(local_198,local_188 + 1);
              }
              if (local_100 != &local_f0) {
                operator_delete(local_100,local_f0 + 1);
              }
              if (local_130 != &local_120) {
                operator_delete(local_130,local_120 + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if (local_170 != &local_160) {
                operator_delete(local_170,local_160 + 1);
              }
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0],local_a0[0] + 1);
              }
              if (local_174 == 0x2600) {
                local_198 = &local_188;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"_","");
                plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
                local_1b8 = &local_1a8;
                plVar8 = plVar4 + 2;
                if ((long *)*plVar4 == plVar8) {
                  local_1a8 = *plVar8;
                  lStack_1a0 = plVar4[3];
                }
                else {
                  local_1a8 = *plVar8;
                  local_1b8 = (long *)*plVar4;
                }
                local_1b0 = plVar4[1];
                *plVar4 = (long)plVar8;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&name,(ulong)local_1b8);
                if (local_1b8 != &local_1a8) {
                  operator_delete(local_1b8,local_1a8 + 1);
                }
                if (local_198 != &local_188) {
                  operator_delete(local_198,local_188 + 1);
                }
              }
              this_00 = (Texture2DFilteringCase *)operator_new(0x128);
              pCVar2 = (local_48->super_TestCaseGroup).m_context;
              Texture2DFilteringCase::Texture2DFilteringCase
                        (this_00,(local_48->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
                         name._M_dataplus._M_p,"",(deUint32)local_78,(deUint32)local_68,
                         (deUint32)local_58,(deUint32)local_58,0x1908,init::formats[lVar12].dataType
                         ,uVar7,init::sizes2D[lVar5].height);
              tcu::TestNode::addChild(node,(TestNode *)this_00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
            }
            lVar5 = 1;
            bVar15 = false;
          } while (bVar11);
          lVar12 = 1;
          puVar10 = (undefined *)0x0;
        } while ((local_104 & 1) != 0);
        uVar6 = local_88 + 1;
      } while (uVar6 != 3);
      lVar5 = 1;
    } while ((local_90 & 1) != 0);
    lVar12 = local_40 + 1;
  } while (lVar12 != 6);
  local_90 = 0;
  do {
    local_70 = (anon_struct_16_2_3f8b7511 *)(ulong)init::minFilterModes[local_90].mode;
    local_174 = init::minFilterModes[local_90].mode & 0xfffffffe;
    puVar10 = &DAT_0076c401;
    local_108 = local_174 ^ 0x2600;
    lVar12 = 0;
    do {
      local_10c = (uint)puVar10;
      local_60 = init::magFilterModes + lVar12;
      local_68 = (ulong)init::magFilterModes[lVar12].mode;
      local_88 = CONCAT44(local_88._4_4_,init::magFilterModes[lVar12].mode) ^ 0x2600;
      local_80 = 0;
      do {
        local_50 = init::wrapModes + local_80;
        uVar1 = init::wrapModes[local_80].mode;
        local_58 = (ulong)uVar1;
        bVar3 = local_108 == 0;
        uVar7 = uVar1 ^ 0x2901 | (uint)local_88;
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 0);
        puVar10 = (undefined *)CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
        lVar12 = 0;
        do {
          bVar14 = local_174 == 0x2600;
          local_78 = CONCAT44(local_78._4_4_,(int)puVar10);
          bVar13 = (byte)puVar10 | (byte)local_104;
          lVar5 = 0;
          bVar15 = true;
          do {
            bVar11 = bVar15;
            uVar7 = init::sizesCube[lVar5].width;
            if ((uVar7 & uVar7 - 1) == 0) {
              bVar15 = (init::sizesCube[lVar5].height & init::sizesCube[lVar5].height - 1U) == 0;
            }
            else {
              bVar15 = false;
            }
            if ((byte)((bVar15 | (uVar1 == 0x812f && bVar3)) & (bVar13 | bVar14)) == 1) {
              local_b0[0] = local_a0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
              plVar4 = (long *)std::__cxx11::string::append((char *)local_b0);
              local_170 = &local_160;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_160 = *plVar8;
                lStack_158 = plVar4[3];
              }
              else {
                local_160 = *plVar8;
                local_170 = (long *)*plVar4;
              }
              local_168 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
              local_150 = &local_140;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_140 = *plVar8;
                lStack_138 = plVar4[3];
              }
              else {
                local_140 = *plVar8;
                local_150 = (long *)*plVar4;
              }
              local_148 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
              local_130 = &local_120;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_120 = *plVar8;
                lStack_118 = plVar4[3];
              }
              else {
                local_120 = *plVar8;
                local_130 = (long *)*plVar4;
              }
              local_128 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
              local_100 = &local_f0;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_f0 = *plVar8;
                lStack_e8 = plVar4[3];
              }
              else {
                local_f0 = *plVar8;
                local_100 = (long *)*plVar4;
              }
              local_f8 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
              local_198 = &local_188;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_188 = *plVar8;
                lStack_180 = plVar4[3];
              }
              else {
                local_188 = *plVar8;
                local_198 = (long *)*plVar4;
              }
              local_190 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
              local_1b8 = &local_1a8;
              plVar8 = plVar4 + 2;
              if ((long *)*plVar4 == plVar8) {
                local_1a8 = *plVar8;
                lStack_1a0 = plVar4[3];
              }
              else {
                local_1a8 = *plVar8;
                local_1b8 = (long *)*plVar4;
              }
              local_1b0 = plVar4[1];
              *plVar4 = (long)plVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar9 = (size_type *)(plVar4 + 2);
              if ((size_type *)*plVar4 == psVar9) {
                name.field_2._M_allocated_capacity = *psVar9;
                name.field_2._8_8_ = plVar4[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar9;
                name._M_dataplus._M_p = (pointer)*plVar4;
              }
              name._M_string_length = plVar4[1];
              *plVar4 = (long)psVar9;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              if (local_1b8 != &local_1a8) {
                operator_delete(local_1b8,local_1a8 + 1);
              }
              if (local_198 != &local_188) {
                operator_delete(local_198,local_188 + 1);
              }
              if (local_100 != &local_f0) {
                operator_delete(local_100,local_f0 + 1);
              }
              if (local_130 != &local_120) {
                operator_delete(local_130,local_120 + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if (local_170 != &local_160) {
                operator_delete(local_170,local_160 + 1);
              }
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0],local_a0[0] + 1);
              }
              if (local_174 == 0x2600) {
                local_198 = &local_188;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"_","");
                plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
                local_1b8 = &local_1a8;
                plVar8 = plVar4 + 2;
                if ((long *)*plVar4 == plVar8) {
                  local_1a8 = *plVar8;
                  lStack_1a0 = plVar4[3];
                }
                else {
                  local_1a8 = *plVar8;
                  local_1b8 = (long *)*plVar4;
                }
                local_1b0 = plVar4[1];
                *plVar4 = (long)plVar8;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&name,(ulong)local_1b8);
                if (local_1b8 != &local_1a8) {
                  operator_delete(local_1b8,local_1a8 + 1);
                }
                if (local_198 != &local_188) {
                  operator_delete(local_198,local_188 + 1);
                }
              }
              this_01 = (TextureCubeFilteringCase *)operator_new(0x128);
              pCVar2 = (local_48->super_TestCaseGroup).m_context;
              TextureCubeFilteringCase::TextureCubeFilteringCase
                        (this_01,(local_48->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
                         name._M_dataplus._M_p,"",(deUint32)local_70,(deUint32)local_68,
                         (deUint32)local_58,(deUint32)local_58,0x1908,init::formats[lVar12].dataType
                         ,uVar7,init::sizesCube[lVar5].height);
              tcu::TestNode::addChild(local_38,(TestNode *)this_01);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
            }
            lVar5 = 1;
            bVar15 = false;
          } while (bVar11);
          lVar12 = 1;
          puVar10 = (undefined *)0x0;
        } while ((local_78 & 1) != 0);
        local_80 = local_80 + 1;
      } while (local_80 != 3);
      lVar12 = 1;
    } while ((local_10c & 1) != 0);
    local_90 = local_90 + 1;
  } while (local_90 != 6);
  return 6;
}

Assistant:

void TextureFilteringTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Filtering");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes2D[] =
	{
		{ "pot",		32, 64 },
		{ "npot",		31, 55 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizesCube[] =
	{
		{ "pot",		64, 64 },
		{ "npot",		63, 63 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE			},
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizes2D,
		{
			bool isMipmap		= minFilterModes[minFilter].mode != GL_NEAREST && minFilterModes[minFilter].mode != GL_LINEAR;
			bool isClamp		= wrapModes[wrapMode].mode == GL_CLAMP_TO_EDGE;
			bool isRepeat		= wrapModes[wrapMode].mode == GL_REPEAT;
			bool isMagNearest	= magFilterModes[magFilter].mode == GL_NEAREST;
			bool isPotSize		= deIsPowerOfTwo32(sizes2D[size].width) && deIsPowerOfTwo32(sizes2D[size].height);

			if ((isMipmap || !isClamp) && !isPotSize)
				continue; // Not supported.

			if ((format != 0) && !(!isMipmap || (isRepeat && isMagNearest)))
				continue; // Skip.

			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name;

			if (!isMipmap)
				name += string("_") + sizes2D[size].name;

			group2D->addChild(new Texture2DFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														 name.c_str(), "",
														 minFilterModes[minFilter].mode,
														 magFilterModes[magFilter].mode,
														 wrapModes[wrapMode].mode,
														 wrapModes[wrapMode].mode,
														 formats[format].format, formats[format].dataType,
														 sizes2D[size].width, sizes2D[size].height));
		})))));

	// Cubemap cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizesCube,
		{
			bool isMipmap		= minFilterModes[minFilter].mode != GL_NEAREST && minFilterModes[minFilter].mode != GL_LINEAR;
			bool isClamp		= wrapModes[wrapMode].mode == GL_CLAMP_TO_EDGE;
			bool isRepeat		= wrapModes[wrapMode].mode == GL_REPEAT;
			bool isMagNearest	= magFilterModes[magFilter].mode == GL_NEAREST;
			bool isPotSize		= deIsPowerOfTwo32(sizesCube[size].width) && deIsPowerOfTwo32(sizesCube[size].height);

			if ((isMipmap || !isClamp) && !isPotSize)
				continue; // Not supported.

			if (format != 0 && !(!isMipmap || (isRepeat && isMagNearest)))
				continue; // Skip.

			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name;

			if (!isMipmap)
				name += string("_") + sizesCube[size].name;

			groupCube->addChild(new TextureCubeFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															 name.c_str(), "",
															 minFilterModes[minFilter].mode,
															 magFilterModes[magFilter].mode,
															 wrapModes[wrapMode].mode,
															 wrapModes[wrapMode].mode,
															 formats[format].format, formats[format].dataType,
															 sizesCube[size].width, sizesCube[size].height));
		})))));
}